

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O1

QString * QLocale::territoryToString(QString *__return_storage_ptr__,Territory territory)

{
  DataPointer *pDVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  storage_type *in_RCX;
  undefined6 in_register_00000032;
  QString *this;
  long in_FS_OFFSET;
  QByteArrayView ba;
  QByteArrayView ba_00;
  QString local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if ((uint)CONCAT62(in_register_00000032,territory) < 0x106) {
    ba_00.m_size = "Default" + territory_name_index[territory];
    this = (QString *)0xffffffffffffffff;
    do {
      pDVar1 = &this->d;
      this = (QString *)((long)&(this->d).d + 1);
    } while ("Default"[(long)&pDVar1->d + (ulong)territory_name_index[territory] + 1] != '\0');
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      ba_00.m_data = (storage_type *)territory_name_index;
      QString::fromUtf8(__return_storage_ptr__,this,ba_00);
      return __return_storage_ptr__;
    }
  }
  else {
    ba.m_data = in_RCX;
    ba.m_size = (qsizetype)"Unknown";
    QString::fromLatin1(&local_38,(QString *)&DAT_00000007,ba);
    qVar4 = local_38.d.size;
    pcVar3 = local_38.d.ptr;
    pDVar2 = local_38.d.d;
    local_38.d.d = (Data *)0x0;
    local_38.d.ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).d = pDVar2;
    (__return_storage_ptr__->d).ptr = pcVar3;
    local_38.d.size = 0;
    (__return_storage_ptr__->d).size = qVar4;
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      return __return_storage_ptr__;
    }
  }
  __stack_chk_fail();
}

Assistant:

QString QLocale::territoryToString(Territory territory)
{
    if (territory > LastTerritory)
        return "Unknown"_L1;
    return QString::fromUtf8(territory_name_list + territory_name_index[territory]);
}